

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split_inl.hpp
# Opt level: O0

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_type loc;
  string *value_local;
  string *name_local;
  string *current_local;
  
  loc = (size_type)value;
  value_local = name;
  name_local = current;
  uVar3 = ::std::__cxx11::string::size();
  if ((2 < uVar3) &&
     (iVar2 = ::std::__cxx11::string::compare((ulong)name_local,0,(char *)0x2), iVar2 == 0)) {
    pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)name_local);
    bVar1 = valid_first_char<char>(*pcVar4);
    if (bVar1) {
      local_30 = ::std::__cxx11::string::find_first_of((char)name_local,0x3d);
      if (local_30 == -1) {
        ::std::__cxx11::string::substr((ulong)local_90,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)value_local,local_90);
        ::std::__cxx11::string::~string(local_90);
        ::std::__cxx11::string::operator=((string *)loc,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)value_local,local_50);
        ::std::__cxx11::string::~string(local_50);
        ::std::__cxx11::string::substr((ulong)local_70,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)loc,local_70);
        ::std::__cxx11::string::~string(local_70);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}